

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

string * DollSerialize_abi_cxx11_(string *__return_storage_ptr__,array<int,_15UL> *list)

{
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long lVar1;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = 0;
  do {
    util::to_string_abi_cxx11_
              (&local_50,(util *)(ulong)*(uint *)((long)list->_M_elems + lVar1),(int)in_RDX);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    lVar1 = lVar1 + 4;
    in_RDX = extraout_RDX;
  } while (lVar1 != 0x3c);
  return __return_storage_ptr__;
}

Assistant:

std::string DollSerialize(const std::array<int, 15> &list)
{
	std::string serialized;

	UTIL_FOREACH(list, item)
	{
		serialized.append(util::to_string(item));
		serialized.append(",");
	}

	return serialized;
}